

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint32_t helper_add_b(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar2 = 0x18;
  bVar3 = 0;
  uVar1 = 0;
  uVar4 = 0;
  uVar5 = 0;
  do {
    uVar6 = ((int)(r2 << ((byte)iVar2 & 0x1f)) >> 0x18) +
            ((int)(r1 << ((byte)iVar2 & 0x1f)) >> 0x18);
    uVar5 = uVar5 | (int)(char)uVar6 != uVar6;
    uVar4 = uVar4 | uVar6 * 2 ^ uVar6;
    uVar1 = uVar1 | (uVar6 & 0xff) << (bVar3 & 0x1f);
    iVar2 = iVar2 + -8;
    bVar3 = bVar3 + 8;
  } while (iVar2 != -8);
  env->PSW_USB_V = uVar5 << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar5 << 0x1f;
  env->PSW_USB_AV = uVar4 << 0x18;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar4 << 0x18;
  return uVar1;
}

Assistant:

uint32_t helper_add_b(CPUTriCoreState *env, target_ulong r1, target_ulong r2)
{
    int32_t b, i;
    int32_t extr_r1, extr_r2;
    int32_t ovf = 0;
    int32_t avf = 0;
    uint32_t ret = 0;

    for (i = 0; i < 4; i++) {
        extr_r1 = sextract32(r1, i * 8, 8);
        extr_r2 = sextract32(r2, i * 8, 8);

        b = extr_r1 + extr_r2;
        ovf |= ((b > 0x7f) || (b < -0x80));
        avf |= b ^ b * 2u;
        ret |= ((b & 0xff) << (i*8));
    }

    env->PSW_USB_V = (ovf << 31);
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 24;
    env->PSW_USB_SAV |= env->PSW_USB_AV;

    return ret;
}